

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::IncompatibleFormatsCompressionTest::IncompatibleFormatsCompressionTest
          (IncompatibleFormatsCompressionTest *this,Context *context)

{
  GLenum GVar1;
  uint uVar2;
  long lVar3;
  value_type local_58;
  IncompatibleFormatsCompressionTest *local_38;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"incompatible_formats_compression",
             "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData are incompatible, one of formats is compressed"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IncompatibleFormatsCompressionTest_01db4d58;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0xfffffffb;
  local_38 = this;
  for (lVar3 = 0; lVar3 != 0x2c; lVar3 = lVar3 + 4) {
    GVar1 = *(GLenum *)((long)&s_valid_targets + lVar3);
    if (((10 < uVar2 + 5) || ((0x487U >> (uVar2 + 5 & 0x1f) & 1) == 0)) && (1 < uVar2)) {
      local_58.m_dst_internal_format = 0x8d70;
      local_58.m_dst_format = 0x8d99;
      local_58.m_dst_type = 0x1405;
      local_58.m_src_internal_format = 0x8dbd;
      local_58.m_src_format = 0x8227;
      local_58.m_src_type = 0x1401;
      local_58.m_expected_result = 0;
      local_58.m_tex_target = GVar1;
      std::
      vector<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_58);
      local_58.m_dst_internal_format = 0x8d76;
      local_58.m_dst_format = 0x8d99;
      local_58.m_dst_type = 0x1403;
      local_58.m_src_internal_format = 0x8dbd;
      local_58.m_src_format = 0x8227;
      local_58.m_src_type = 0x1401;
      local_58.m_expected_result = 0x502;
      local_58.m_tex_target = GVar1;
      std::
      vector<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_58);
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

IncompatibleFormatsCompressionTest::IncompatibleFormatsCompressionTest(deqp::Context& context)
	: TestCase(context, "incompatible_formats_compression", "Test verifies if INVALID_OPERATION is generated when "
															"textures provided to CopySubImageData are incompatible, "
															"one of formats is compressed")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		/* Skip 1D targets, not supported */
		if ((GL_TEXTURE_1D == tex_target) || (GL_TEXTURE_1D_ARRAY == tex_target) || (GL_TEXTURE_3D == tex_target) ||
			(GL_TEXTURE_RECTANGLE == tex_target) || (GL_RENDERBUFFER == tex_target))
		{
			continue;
		}

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		/* Compressed 128bit vs RGBA32UI */
		{
			testCase test_case = {
				tex_target, GL_RGBA32UI,	  GL_RGBA_INTEGER, GL_UNSIGNED_INT, GL_COMPRESSED_RG_RGTC2,
				GL_RG,		GL_UNSIGNED_BYTE, GL_NO_ERROR
			};

			m_test_cases.push_back(test_case);
		}

		/* Compressed 128bit vs RGBA16UI */
		{
			testCase test_case = {
				tex_target, GL_RGBA16UI,	  GL_RGBA_INTEGER,	 GL_UNSIGNED_SHORT, GL_COMPRESSED_RG_RGTC2,
				GL_RG,		GL_UNSIGNED_BYTE, GL_INVALID_OPERATION
			};

			m_test_cases.push_back(test_case);
		}
	}
}